

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
StringBuilder<char[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2]>
          (char (*arg) [2],unsigned_long *args,char (*args_1) [2],char *args_2,char (*args_3) [2],
          unsigned_long *args_4,char (*args_5) [2],char *args_6,char (*args_7) [2],
          unsigned_long *args_8,char (*args_9) [2],char *args_10,char (*args_11) [2])

{
  unsigned_long *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char (*in_R8) [2];
  char *in_R9;
  char (*unaff_R14) [2];
  char *unaff_R15;
  char (*unaff_retaddr) [2];
  unsigned_long *in_stack_00000008;
  char (*in_stack_00000010) [2];
  char *in_stack_00000018;
  char (*in_stack_00000020) [2];
  char *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_90 [32];
  string local_70 [16];
  unsigned_long *in_stack_ffffffffffffffa0;
  char (*in_stack_ffffffffffffffa8) [2];
  
  __lhs = in_RDI;
  StringBuilder_abi_cxx11_(in_stack_ffffffffffffff48);
  StringBuilder<unsigned_long,char_const(&)[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2]>
            (in_RCX,in_R8,in_R9,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,unaff_R14,
             unaff_R15,unaff_retaddr,in_stack_00000008,in_stack_00000010,in_stack_00000018,
             in_stack_00000020);
  std::operator+(__lhs,in_RDI);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_70);
  return __lhs;
}

Assistant:

std::string StringBuilder(const T & arg, Targs && ... args)
{
    return StringBuilder(arg) + StringBuilder(std::forward<Targs>(args)...);
}